

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_currencysymbols.h
# Opt level: O1

void __thiscall icu_63::number::impl::CurrencySymbols::~CurrencySymbols(CurrencySymbols *this)

{
  UnicodeString::~UnicodeString(&this->fIntlCurrencySymbol);
  UnicodeString::~UnicodeString(&this->fCurrencySymbol);
  MaybeStackArray<char,_40>::~MaybeStackArray(&(this->fLocaleName).buffer);
  CurrencyUnit::~CurrencyUnit(&this->fCurrency);
  return;
}

Assistant:

class U_I18N_API CurrencySymbols : public UMemory {
  public:
    CurrencySymbols() = default; // default constructor: leaves class in valid but undefined state

    /** Creates an instance in which all symbols are loaded from data. */
    CurrencySymbols(CurrencyUnit currency, const Locale& locale, UErrorCode& status);

    /** Creates an instance in which some symbols might be pre-populated. */
    CurrencySymbols(CurrencyUnit currency, const Locale& locale, const DecimalFormatSymbols& symbols,
                    UErrorCode& status);

    const char16_t* getIsoCode() const;

    UnicodeString getNarrowCurrencySymbol(UErrorCode& status) const;

    UnicodeString getCurrencySymbol(UErrorCode& status) const;

    UnicodeString getIntlCurrencySymbol(UErrorCode& status) const;

    UnicodeString getPluralName(StandardPlural::Form plural, UErrorCode& status) const;

  protected:
    // Required fields:
    CurrencyUnit fCurrency;
    CharString fLocaleName;

    // Optional fields:
    UnicodeString fCurrencySymbol;
    UnicodeString fIntlCurrencySymbol;

    UnicodeString loadSymbol(UCurrNameStyle selector, UErrorCode& status) const;
}